

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.hpp
# Opt level: O2

void __thiscall OpenMD::NPTf::NPTf(NPTf *this,SimInfo *info)

{
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPTf_002be348;
  SquareMatrix<double,_3>::SquareMatrix(&(this->eta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->oldEta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->prevEta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->vScale).super_SquareMatrix<double,_3>);
  return;
}

Assistant:

NPTf(SimInfo* info) : NPT(info) {}